

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

int __thiscall CGraphics_Threaded::IssueInit(CGraphics_Threaded *this)

{
  int iVar1;
  long in_RDI;
  int Flags;
  uint local_24;
  
  local_24 = 0;
  if (*(int *)(*(long *)(in_RDI + 0x90) + 0xea4) != 0) {
    local_24 = 8;
  }
  if (*(int *)(*(long *)(in_RDI + 0x90) + 0xea8) != 0) {
    local_24 = local_24 | 1;
  }
  if (*(int *)(*(long *)(in_RDI + 0x90) + 0xeb0) != 0) {
    local_24 = local_24 | 2;
  }
  if (*(int *)(*(long *)(in_RDI + 0x90) + 0xeb8) != 0) {
    local_24 = local_24 | 0x20;
  }
  if (*(int *)(*(long *)(in_RDI + 0x90) + 0x129c) != 0) {
    local_24 = local_24 | 4;
  }
  if (*(int *)(*(long *)(in_RDI + 0x90) + 0xedc) != 0) {
    local_24 = local_24 | 0x10;
  }
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x60) + 0x10))
                    (*(long **)(in_RDI + 0x60),"Teeworlds",*(long *)(in_RDI + 0x90) + 0xe98,
                     *(long *)(in_RDI + 0x90) + 0xe9c,*(long *)(in_RDI + 0x90) + 0xea0,in_RDI + 0x10
                     ,in_RDI + 0x14,*(undefined4 *)(*(long *)(in_RDI + 0x90) + 0xec8),local_24,
                     in_RDI + 0x18,in_RDI + 0x1c);
  return iVar1;
}

Assistant:

int CGraphics_Threaded::IssueInit()
{
	int Flags = 0;
	if(m_pConfig->m_GfxBorderless) Flags |= IGraphicsBackend::INITFLAG_BORDERLESS;
	if(m_pConfig->m_GfxFullscreen) Flags |= IGraphicsBackend::INITFLAG_FULLSCREEN;
	if(m_pConfig->m_GfxVsync) Flags |= IGraphicsBackend::INITFLAG_VSYNC;
	if(m_pConfig->m_GfxHighdpi) Flags |= IGraphicsBackend::INITFLAG_HIGHDPI;
	if(m_pConfig->m_DbgResizable) Flags |= IGraphicsBackend::INITFLAG_RESIZABLE;
	if(m_pConfig->m_GfxUseX11XRandRWM) Flags |= IGraphicsBackend::INITFLAG_X11XRANDR;

	return m_pBackend->Init("Teeworlds", &m_pConfig->m_GfxScreen, &m_pConfig->m_GfxScreenWidth,
			&m_pConfig->m_GfxScreenHeight, &m_ScreenWidth, &m_ScreenHeight, m_pConfig->m_GfxFsaaSamples,
			Flags, &m_DesktopScreenWidth, &m_DesktopScreenHeight);
}